

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::parallel_hash_set(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    *this,allocator_type *alloc)

{
  StatefulTestingEqual local_28;
  StatefulTestingHash local_20;
  allocator_type *local_18;
  allocator_type *alloc_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *this_local;
  
  local_18 = alloc;
  alloc_local = (allocator_type *)this;
  memset(&local_20,0,8);
  StatefulTestingHash::StatefulTestingHash(&local_20);
  memset(&local_28,0,8);
  StatefulTestingEqual::StatefulTestingEqual(&local_28);
  parallel_hash_set(this,0,&local_20,&local_28,local_18);
  return;
}

Assistant:

explicit parallel_hash_set(const allocator_type& alloc)
        : parallel_hash_set(0, hasher(), key_equal(), alloc) {}